

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_buildSuperBlockEntropy_literal
                 (void *src,size_t srcSize,ZSTD_hufCTables_t *prevHuf,ZSTD_hufCTables_t *nextHuf,
                 ZSTD_hufCTablesMetadata_t *hufMetadata,void *workspace,size_t wkspSize)

{
  uint uVar1;
  ZSTD_hufCTables_t *code;
  void *code_00;
  size_t sVar2;
  size_t hSize;
  size_t cSize;
  size_t err_code_1;
  size_t maxBits;
  size_t err_code;
  size_t largest;
  size_t minLitSize;
  uint huffLog;
  uint maxSymbolValue;
  size_t nodeWkspSize;
  BYTE *nodeWksp;
  size_t countWkspSize;
  uint *countWksp;
  BYTE *countWkspStart;
  BYTE *wkspEnd;
  BYTE *wkspStart;
  void *workspace_local;
  ZSTD_hufCTablesMetadata_t *hufMetadata_local;
  ZSTD_hufCTables_t *nextHuf_local;
  ZSTD_hufCTables_t *prevHuf_local;
  size_t srcSize_local;
  void *src_local;
  
  countWkspStart = (BYTE *)((long)workspace + wkspSize);
  nodeWksp = (BYTE *)0x400;
  nodeWkspSize = (long)workspace + 0x400;
  _huffLog = (long)countWkspStart - nodeWkspSize;
  minLitSize._4_4_ = 0xff;
  minLitSize._0_4_ = 0xb;
  countWkspSize = (size_t)workspace;
  countWksp = (uint *)workspace;
  wkspEnd = (BYTE *)workspace;
  wkspStart = (BYTE *)workspace;
  workspace_local = hufMetadata;
  hufMetadata_local = (ZSTD_hufCTablesMetadata_t *)nextHuf;
  nextHuf_local = prevHuf;
  prevHuf_local = (ZSTD_hufCTables_t *)srcSize;
  srcSize_local = (size_t)src;
  memcpy(nextHuf,prevHuf,0x404);
  if (prevHuf_local < (ZSTD_hufCTables_t *)0x40) {
    *(undefined4 *)workspace_local = 0;
    src_local = (void *)0x0;
  }
  else {
    code = (ZSTD_hufCTables_t *)
           HIST_count_wksp((uint *)countWkspSize,(uint *)((long)&minLitSize + 4),
                           (void *)srcSize_local,(size_t)prevHuf_local,wkspStart,wkspSize);
    uVar1 = ERR_isError((size_t)code);
    src_local = code;
    if (uVar1 == 0) {
      if (code == prevHuf_local) {
        *(undefined4 *)workspace_local = 1;
        src_local = (void *)0x0;
      }
      else if ((ZSTD_hufCTables_t *)(((ulong)prevHuf_local >> 7) + 4) < code) {
        memset(hufMetadata_local,0,0x400);
        minLitSize._0_4_ =
             HUF_optimalTableLog((uint)minLitSize,(size_t)prevHuf_local,minLitSize._4_4_);
        code_00 = (void *)HUF_buildCTable_wksp
                                    ((HUF_CElt *)hufMetadata_local,(uint *)countWkspSize,
                                     minLitSize._4_4_,(uint)minLitSize,(void *)nodeWkspSize,_huffLog
                                    );
        uVar1 = ERR_isError((size_t)code_00);
        src_local = code_00;
        if (uVar1 == 0) {
          minLitSize._0_4_ = (uint)code_00;
          sVar2 = HUF_estimateCompressedSize
                            ((HUF_CElt *)hufMetadata_local,(uint *)countWkspSize,minLitSize._4_4_);
          src_local = (void *)HUF_writeCTable((void *)((long)workspace_local + 4),500,
                                              (HUF_CElt *)hufMetadata_local,minLitSize._4_4_,
                                              (uint)minLitSize);
          if ((ZSTD_hufCTables_t *)(sVar2 + (long)src_local) < prevHuf_local) {
            *(undefined4 *)workspace_local = 2;
          }
          else {
            *(undefined4 *)workspace_local = 0;
            src_local = (void *)0x0;
          }
        }
      }
      else {
        *(undefined4 *)workspace_local = 0;
        src_local = (void *)0x0;
      }
    }
  }
  return (size_t)src_local;
}

Assistant:

static size_t ZSTD_buildSuperBlockEntropy_literal(void* const src, size_t srcSize,
                                            const ZSTD_hufCTables_t* prevHuf,
                                                  ZSTD_hufCTables_t* nextHuf,
                                                  ZSTD_hufCTablesMetadata_t* hufMetadata,
                                                  void* workspace, size_t wkspSize)
{
    BYTE* const wkspStart = (BYTE*)workspace;
    BYTE* const wkspEnd = wkspStart + wkspSize;
    BYTE* const countWkspStart = wkspStart;
    unsigned* const countWksp = (unsigned*)workspace;
    const size_t countWkspSize = (HUF_SYMBOLVALUE_MAX + 1) * sizeof(unsigned);
    BYTE* const nodeWksp = countWkspStart + countWkspSize;
    const size_t nodeWkspSize = wkspEnd-nodeWksp;
    unsigned maxSymbolValue = 255;
    unsigned huffLog = 11;

    DEBUGLOG(5, "ZSTD_buildSuperBlockEntropy_literal (srcSize=%zu)", srcSize);

    /* Prepare nextEntropy assuming reusing the existing table */
    memcpy(nextHuf, prevHuf, sizeof(*prevHuf));

    /* small ? don't even attempt compression (speed opt) */
#   define COMPRESS_LITERALS_SIZE_MIN 63
    {   size_t const minLitSize = COMPRESS_LITERALS_SIZE_MIN;
        if (srcSize <= minLitSize) { hufMetadata->hType = set_basic; return 0; }
    }

    /* Scan input and build symbol stats */
    {   size_t const largest = HIST_count_wksp (countWksp, &maxSymbolValue, (const BYTE*)src, srcSize, workspace, wkspSize);
        FORWARD_IF_ERROR(largest);
        if (largest == srcSize) { hufMetadata->hType = set_rle; return 0; }
        if (largest <= (srcSize >> 7)+4) { hufMetadata->hType = set_basic; return 0; }
    }


    /* Build Huffman Tree */
    memset(nextHuf->CTable, 0, sizeof(nextHuf->CTable));
    huffLog = HUF_optimalTableLog(huffLog, srcSize, maxSymbolValue);
    {   size_t const maxBits = HUF_buildCTable_wksp((HUF_CElt*)nextHuf->CTable, countWksp,
                                                    maxSymbolValue, huffLog,
                                                    nodeWksp, nodeWkspSize);
        FORWARD_IF_ERROR(maxBits);
        huffLog = (U32)maxBits;
        {   size_t cSize = HUF_estimateCompressedSize(
                              (HUF_CElt*)nextHuf->CTable, countWksp, maxSymbolValue);
            size_t hSize = HUF_writeCTable(
                              hufMetadata->hufDesBuffer, sizeof(hufMetadata->hufDesBuffer),
                              (HUF_CElt*)nextHuf->CTable, maxSymbolValue, huffLog);
            if (cSize + hSize >= srcSize) { hufMetadata->hType = set_basic; return 0; }
            hufMetadata->hType = set_compressed;
            return hSize;
        }
    }
}